

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t ra_portable_serialize(roaring_array_t *ra,char *buf)

{
  _Bool _Var1;
  uint8_t uVar2;
  uint uVar3;
  int iVar4;
  int32_t iVar5;
  void *__src;
  int local_50;
  int local_4c;
  int32_t k_2;
  int32_t k_1;
  uint16_t card;
  int32_t k;
  uint32_t cookie_1;
  int32_t i;
  uint8_t *bitmapOfRunContainers;
  uint32_t s;
  uint32_t cookie;
  _Bool hasrun;
  uint32_t startOffset;
  char *initbuf;
  char *buf_local;
  roaring_array_t *ra_local;
  
  _Var1 = ra_has_run_container(ra);
  if (_Var1) {
    *(uint *)buf = (ra->size + -1) * 0x10000 | 0x303b;
    uVar3 = (ra->size + 7) / 8;
    __src = calloc((ulong)uVar3,1);
    if (__src == (void *)0x0) {
      __assert_fail("bitmapOfRunContainers != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x486f,"size_t ra_portable_serialize(const roaring_array_t *, char *)");
    }
    for (k = 0; k < ra->size; k = k + 1) {
      uVar2 = get_container_type(ra->containers[k],ra->typecodes[k]);
      if (uVar2 == '\x03') {
        *(byte *)((long)__src + (long)(k / 8)) =
             *(byte *)((long)__src + (long)(k / 8)) | (byte)(1 << ((byte)((long)k % 8) & 0x1f));
      }
    }
    memcpy(buf + 4,__src,(ulong)uVar3);
    initbuf = buf + 4 + uVar3;
    free(__src);
    if (ra->size < 4) {
      iVar4 = ra->size * 4;
    }
    else {
      iVar4 = ra->size * 8;
    }
    cookie = iVar4 + 4 + uVar3;
  }
  else {
    buf[0] = ':';
    buf[1] = '0';
    buf[2] = '\0';
    buf[3] = '\0';
    *(int32_t *)(buf + 4) = ra->size;
    initbuf = buf + 8;
    cookie = ra->size * 4 + 8 + ra->size * 4;
  }
  for (k_1 = 0; k_1 < ra->size; k_1 = k_1 + 1) {
    *(uint16_t *)initbuf = ra->keys[k_1];
    iVar4 = container_get_cardinality(ra->containers[k_1],ra->typecodes[k_1]);
    *(short *)(initbuf + 2) = (short)iVar4 + -1;
    initbuf = initbuf + 4;
  }
  if ((!_Var1) || (3 < ra->size)) {
    for (local_4c = 0; local_4c < ra->size; local_4c = local_4c + 1) {
      *(uint32_t *)initbuf = cookie;
      initbuf = initbuf + 4;
      iVar5 = container_size_in_bytes(ra->containers[local_4c],ra->typecodes[local_4c]);
      cookie = cookie + iVar5;
    }
  }
  for (local_50 = 0; local_50 < ra->size; local_50 = local_50 + 1) {
    iVar5 = container_write(ra->containers[local_50],ra->typecodes[local_50],initbuf);
    initbuf = initbuf + iVar5;
  }
  return (long)initbuf - (long)buf;
}

Assistant:

size_t ra_portable_serialize(const roaring_array_t *ra, char *buf) {
    char *initbuf = buf;
    uint32_t startOffset = 0;
    bool hasrun = ra_has_run_container(ra);
    if (hasrun) {
        uint32_t cookie = SERIAL_COOKIE | ((ra->size - 1) << 16);
        memcpy(buf, &cookie, sizeof(cookie));
        buf += sizeof(cookie);
        uint32_t s = (ra->size + 7) / 8;
        uint8_t *bitmapOfRunContainers = (uint8_t *)calloc(s, 1);
        assert(bitmapOfRunContainers != NULL);  // todo: handle
        for (int32_t i = 0; i < ra->size; ++i) {
            if (get_container_type(ra->containers[i], ra->typecodes[i]) ==
                RUN_CONTAINER_TYPE) {
                bitmapOfRunContainers[i / 8] |= (1 << (i % 8));
            }
        }
        memcpy(buf, bitmapOfRunContainers, s);
        buf += s;
        free(bitmapOfRunContainers);
        if (ra->size < NO_OFFSET_THRESHOLD) {
            startOffset = 4 + 4 * ra->size + s;
        } else {
            startOffset = 4 + 8 * ra->size + s;
        }
    } else {  // backwards compatibility
        uint32_t cookie = SERIAL_COOKIE_NO_RUNCONTAINER;

        memcpy(buf, &cookie, sizeof(cookie));
        buf += sizeof(cookie);
        memcpy(buf, &ra->size, sizeof(ra->size));
        buf += sizeof(ra->size);

        startOffset = 4 + 4 + 4 * ra->size + 4 * ra->size;
    }
    for (int32_t k = 0; k < ra->size; ++k) {
        memcpy(buf, &ra->keys[k], sizeof(ra->keys[k]));
        buf += sizeof(ra->keys[k]);
        // get_cardinality returns a value in [1,1<<16], subtracting one
        // we get [0,1<<16 - 1] which fits in 16 bits
        uint16_t card = (uint16_t)(
            container_get_cardinality(ra->containers[k], ra->typecodes[k]) - 1);
        memcpy(buf, &card, sizeof(card));
        buf += sizeof(card);
    }
    if ((!hasrun) || (ra->size >= NO_OFFSET_THRESHOLD)) {
        // writing the containers offsets
        for (int32_t k = 0; k < ra->size; k++) {
            memcpy(buf, &startOffset, sizeof(startOffset));
            buf += sizeof(startOffset);
            startOffset =
                startOffset +
                container_size_in_bytes(ra->containers[k], ra->typecodes[k]);
        }
    }
    for (int32_t k = 0; k < ra->size; ++k) {
        buf += container_write(ra->containers[k], ra->typecodes[k], buf);
    }
    return buf - initbuf;
}